

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_invalidate_phys_page_fast_ppc
               (uc_struct_conflict10 *uc,page_collection *pages,tb_page_addr_t start,int len,
               uintptr_t retaddr)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  PageDesc *pages_00;
  unsigned_long *puVar4;
  PageDesc *pPVar5;
  uintptr_t in_R9;
  uint *puVar6;
  
  pages_00 = page_find(uc,start >> 0xc);
  if (pages_00 != (PageDesc *)0x0) {
    puVar4 = pages_00->code_bitmap;
    if (puVar4 == (unsigned_long *)0x0) {
      uVar2 = pages_00->code_write_count + 1;
      pages_00->code_write_count = uVar2;
      if (uVar2 < 10) goto LAB_00943bae;
      puVar4 = (unsigned_long *)g_try_malloc0(0x200);
      if (puVar4 == (unsigned_long *)0x0) {
        abort();
      }
      pages_00->code_bitmap = puVar4;
      pPVar5 = pages_00;
      while( true ) {
        uVar1 = pPVar5->first_tb;
        puVar6 = (uint *)(uVar1 & 0xfffffffffffffffe);
        if (puVar6 == (uint *)0x0) break;
        if ((uVar1 & 1) == 0) {
          uVar3 = *puVar6 & 0xfff;
          uVar2 = (ushort)puVar6[3] + uVar3;
          if (0xfff < uVar2) {
            uVar2 = 0x1000;
          }
        }
        else {
          uVar3 = 0;
          uVar2 = *puVar6 + puVar6[3] & 0xfff;
        }
        qemu_bitmap_set(pages_00->code_bitmap,(ulong)uVar3,(long)(int)(uVar2 - uVar3));
        pPVar5 = (PageDesc *)(puVar6 + (ulong)((uint)uVar1 & 1) * 2 + 0xc);
      }
      puVar4 = pages_00->code_bitmap;
      if (puVar4 == (unsigned_long *)0x0) goto LAB_00943bae;
    }
    if (((uint)(*(ulong *)((long)puVar4 + (ulong)((uint)(start >> 3) & 0x1f8)) >>
               ((byte)start & 0x3f)) & ~(-1 << ((byte)len & 0x1f))) != 0) {
LAB_00943bae:
      tb_invalidate_phys_page_range__locked
                (uc,(page_collection *)pages_00,(PageDesc *)start,(long)len + start,retaddr,in_R9);
      return;
    }
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_fast(struct uc_struct *uc, struct page_collection *pages,
                                  tb_page_addr_t start, int len,
                                  uintptr_t retaddr)
{
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (!p) {
        return;
    }

    assert_page_locked(p);
    if (!p->code_bitmap &&
        ++p->code_write_count >= SMC_BITMAP_USE_THRESHOLD) {
        build_page_bitmap(uc, p);
    }
    if (p->code_bitmap) {
        unsigned int nr;
        unsigned long b;

        nr = start & ~TARGET_PAGE_MASK;
        b = p->code_bitmap[BIT_WORD(nr)] >> (nr & (BITS_PER_LONG - 1));
        if (b & ((1 << len) - 1)) {
            goto do_invalidate;
        }
    } else {
    do_invalidate:
        tb_invalidate_phys_page_range__locked(uc, pages, p, start, start + len,
                                              retaddr);
    }
}